

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmConsole::read_script_param(CVmConsole *this,char *buf,size_t buflen,osfildef *fp)

{
  int iVar1;
  
  if (buflen != 0) {
    do {
      iVar1 = fgetc((FILE *)fp);
      if ((iVar1 == 10) || (iVar1 == -1)) {
        *buf = '\0';
      }
      else if (buflen < 2) {
        buflen = 1;
      }
      else {
        *buf = (char)iVar1;
        buf = buf + 1;
        buflen = buflen - 1;
      }
    } while ((iVar1 != 10) && (iVar1 != -1));
    return 1;
  }
  return 0;
}

Assistant:

int CVmConsole::read_script_param(char *buf, size_t buflen, osfildef *fp)
{
    /* ignore zero-size buffer requests */
    if (buflen == 0)
        return FALSE;

    /* read characters until we run out of buffer or reach a newline */
    for (;;)
    {
        /* get the next character */
        int c = osfgetc(fp);

        /* if it's a newline or end of file, we're done */
        if (c == '\n' || c == EOF)
        {
            /* null-terminate the buffer */
            *buf = '\0';

            /* indicate success */
            return TRUE;
        }

        /* 
         *   if there's room in the buffer, add the character - always leave
         *   one byte for the null terminator 
         */
        if (buflen > 1)
        {
            *buf++ = (char)c;
            --buflen;
        }
    }
}